

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

bool __thiscall QLayoutPrivate::checkWidget(QLayoutPrivate *this,QWidget *widget)

{
  QLayout *pQVar1;
  QWidget *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QWidget *in_RSI;
  QLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QLayout *q;
  char *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  QLayout *in_stack_ffffffffffffff30;
  bool local_91;
  QString local_90;
  QString local_78;
  char local_60 [32];
  QString local_40;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  if (in_RSI == (QWidget *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
    (*(code *)**(undefined8 **)pQVar1)();
    uVar3 = QMetaObject::className();
    QObject::objectName();
    QtPrivate::asString(&local_40);
    uVar4 = QString::utf16();
    QMessageLogger::warning(local_28,"QLayout: Cannot add a null widget to %s/%ls",uVar3,uVar4);
    QString::~QString((QString *)0x33e87c);
    local_91 = false;
  }
  else {
    pQVar2 = QLayout::parentWidget(in_stack_ffffffffffffff30);
    if (in_RSI == pQVar2) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
      (*(code *)**(undefined8 **)in_RSI)();
      uVar3 = QMetaObject::className();
      QObject::objectName();
      QtPrivate::asString(&local_78);
      uVar4 = QString::utf16();
      (*(code *)**(undefined8 **)pQVar1)();
      uVar5 = QMetaObject::className();
      QObject::objectName();
      QtPrivate::asString(&local_90);
      uVar6 = QString::utf16();
      QMessageLogger::warning
                (local_60,"QLayout: Cannot add parent widget %s/%ls to its child layout %s/%ls",
                 uVar3,uVar4,uVar5,uVar6);
      QString::~QString((QString *)0x33e972);
      QString::~QString((QString *)0x33e97c);
      local_91 = false;
    }
    else {
      local_91 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_91;
  }
  __stack_chk_fail();
}

Assistant:

bool QLayoutPrivate::checkWidget(QWidget *widget) const
{
    Q_Q(const QLayout);
    if (Q_UNLIKELY(!widget)) {
        qWarning("QLayout: Cannot add a null widget to %s/%ls", q->metaObject()->className(),
                  qUtf16Printable(q->objectName()));
        return false;
    }
    if (Q_UNLIKELY(widget == q->parentWidget())) {
        qWarning("QLayout: Cannot add parent widget %s/%ls to its child layout %s/%ls",
                  widget->metaObject()->className(), qUtf16Printable(widget->objectName()),
                  q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    return true;
}